

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimSnapshotManager.cpp
# Opt level: O3

Snapshot * __thiscall OpenMD::SimSnapshotManager::getSnapshot(SimSnapshotManager *this,int id)

{
  Snapshot *pSVar1;
  int iVar2;
  
  pSVar1 = (this->super_SnapshotManager).currentSnapshot_;
  if ((pSVar1 != (Snapshot *)0x0) && (iVar2 = Snapshot::getID(pSVar1), iVar2 == id)) {
    return (this->super_SnapshotManager).currentSnapshot_;
  }
  pSVar1 = (this->super_SnapshotManager).previousSnapshot_;
  if ((pSVar1 != (Snapshot *)0x0) && (iVar2 = Snapshot::getID(pSVar1), iVar2 == id)) {
    return (this->super_SnapshotManager).previousSnapshot_;
  }
  return (Snapshot *)0x0;
}

Assistant:

Snapshot* SimSnapshotManager::getSnapshot(int id) {
    if (currentSnapshot_ != NULL && currentSnapshot_->getID() == id) {
      return currentSnapshot_;
    } else if (previousSnapshot_ != NULL && previousSnapshot_->getID() == id) {
      return previousSnapshot_;
    } else {
      return NULL;
    }
  }